

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O3

bool __thiscall
duckdb::ExpressionFilter::EvaluateWithConstant
          (ExpressionFilter *this,ExpressionExecutor *executor,Value *val)

{
  idx_t iVar1;
  SelectionVector sel;
  DataChunk input;
  SelectionVector local_70;
  DataChunk local_58;
  
  DataChunk::DataChunk(&local_58);
  ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Value_const&>
            ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_58,val);
  local_58.count = 1;
  SelectionVector::SelectionVector(&local_70,1);
  iVar1 = ExpressionExecutor::SelectExpression(executor,&local_58,&local_70);
  if (local_70.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  DataChunk::~DataChunk(&local_58);
  return iVar1 != 0;
}

Assistant:

bool ExpressionFilter::EvaluateWithConstant(ExpressionExecutor &executor, const Value &val) const {
	DataChunk input;
	input.data.emplace_back(val);
	input.SetCardinality(1);

	SelectionVector sel(1);

	idx_t count = executor.SelectExpression(input, sel);
	return count > 0;
}